

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::loadConstructedPoint<(TasGrid::RuleLocal::erule)0>
          (GridLocalPolynomial *this,double *x,vector<double,_std::allocator<double>_> *y)

{
  int iVar1;
  pointer pSVar2;
  reference pvVar3;
  NodeData local_88;
  int local_58;
  int local_54;
  int j;
  int lvl;
  byte local_45 [8];
  bool isConnected;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> p;
  vector<double,_std::allocator<double>_> *y_local;
  double *x_local;
  GridLocalPolynomial *this_local;
  
  p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)y;
  getMultiIndex<(TasGrid::RuleLocal::erule)0>((vector<int,_std::allocator<int>_> *)local_38,this,x);
  pSVar2 = ::std::
           unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
           ::operator->((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                         *)&this->dynamic_values);
  MultiIndexSet::removeIndex(&pSVar2->initial_points,(vector<int,_std::allocator<int>_> *)local_38);
  local_45[0] = 0;
  _j = (bool *)local_45;
  HierarchyManipulations::
  touchAllImmediateRelatives<(TasGrid::RuleLocal::erule)0,TasGrid::GridLocalPolynomial::loadConstructedPoint<(TasGrid::RuleLocal::erule)0>(double_const*,std::vector<double,std::allocator<double>>const&)::_lambda(int)_1_>
            ((vector<int,_std::allocator<int>_> *)local_38,&(this->super_BaseCanonicalGrid).points,
             _j);
  pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_38,0);
  local_54 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)0>(*pvVar3);
  for (local_58 = 1; local_58 < (this->super_BaseCanonicalGrid).num_dimensions;
      local_58 = local_58 + 1) {
    pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,(long)local_58);
    iVar1 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)0>(*pvVar3);
    local_54 = iVar1 + local_54;
  }
  if (((local_45[0] & 1) == 0) && (local_54 != 0)) {
    pSVar2 = ::std::
             unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ::operator->((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                           *)&this->dynamic_values);
    ::std::vector<int,_std::allocator<int>_>::vector
              (&local_88.point,(vector<int,_std::allocator<int>_> *)local_38);
    ::std::vector<double,_std::allocator<double>_>::vector
              (&local_88.value,
               (vector<double,_std::allocator<double>_> *)
               p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage);
    ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::push_front
              (&pSVar2->data,&local_88);
    NodeData::~NodeData(&local_88);
  }
  else {
    expandGrid<(TasGrid::RuleLocal::erule)0>
              (this,(vector<int,_std::allocator<int>_> *)local_38,
               (vector<double,_std::allocator<double>_> *)
               p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage);
    loadConstructedPoints<(TasGrid::RuleLocal::erule)0>(this);
  }
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  return;
}

Assistant:

void GridLocalPolynomial::loadConstructedPoint(const double x[], const std::vector<double> &y){
    auto p = getMultiIndex<effrule>(x);

    dynamic_values->initial_points.removeIndex(p);

    bool isConnected = false;
    HierarchyManipulations::touchAllImmediateRelatives<effrule>(p, points, [&](int)->void{ isConnected = true; });
    int lvl = RuleLocal::getLevel<effrule>(p[0]);
    for(int j=1; j<num_dimensions; j++) lvl += RuleLocal::getLevel<effrule>(p[j]);

    if (isConnected || (lvl == 0)){
        expandGrid<effrule>(p, y);
        loadConstructedPoints<effrule>();
    }else{
        dynamic_values->data.push_front({p, y});
    }
}